

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cpp
# Opt level: O0

bool __thiscall boost::thread::start_thread_noexcept(thread *this,attributes *attr)

{
  bool bVar1;
  type ptVar2;
  element_type *__arg;
  thread_attributes *in_RSI;
  shared_ptr<boost::detail::thread_data_base> *in_RDI;
  thread_data_ptr local_thread_info;
  int detached_state;
  int res;
  native_handle_type *h;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffffa8;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffffb8;
  pthread_t *__newthread;
  shared_ptr<boost::detail::thread_data_base> *in_stack_ffffffffffffffc0;
  native_handle_type *__attr;
  shared_ptr local_38 [16];
  int local_28;
  int local_24;
  native_handle_type *local_20;
  thread_attributes *local_18;
  bool local_1;
  
  local_18 = in_RSI;
  shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
  shared_ptr<boost::detail::thread_data_base>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  local_20 = thread_attributes::native_handle(local_18);
  ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
  __newthread = &ptVar2->thread_handle;
  __attr = local_20;
  __arg = shared_ptr<boost::detail::thread_data_base>::get(in_RDI);
  local_24 = pthread_create(__newthread,(pthread_attr_t *)__attr,(anonymous_namespace)::thread_proxy
                            ,__arg);
  if (local_24 == 0) {
    local_24 = pthread_attr_getdetachstate((pthread_attr_t *)local_20,&local_28);
    if (local_24 == 0) {
      if (local_28 == 1) {
        shared_ptr<boost::detail::thread_data_base>::shared_ptr
                  ((shared_ptr<boost::detail::thread_data_base> *)0x2a31d4);
        shared_ptr<boost::detail::thread_data_base>::swap(in_RDI,in_stack_ffffffffffffffa8);
        bVar1 = boost::shared_ptr::operator_cast_to_bool(local_38);
        if ((bVar1) &&
           (ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI),
           (ptVar2->join_started & 1U) == 0)) {
          ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
          ptVar2->join_started = true;
          ptVar2 = shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
          ptVar2->joined = true;
        }
        shared_ptr<boost::detail::thread_data_base>::~shared_ptr
                  ((shared_ptr<boost::detail::thread_data_base> *)0x2a3234);
      }
      local_1 = true;
    }
    else {
      shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
      shared_ptr<boost::detail::thread_data_base>::reset
                ((shared_ptr<boost::detail::thread_data_base> *)__attr);
      local_1 = false;
    }
  }
  else {
    shared_ptr<boost::detail::thread_data_base>::operator->(in_RDI);
    shared_ptr<boost::detail::thread_data_base>::reset
              ((shared_ptr<boost::detail::thread_data_base> *)__attr);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool thread::start_thread_noexcept(const attributes& attr)
    {
        thread_info->self=thread_info;
        const attributes::native_handle_type* h = attr.native_handle();
        int res = pthread_create(&thread_info->thread_handle, h, &thread_proxy, thread_info.get());
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        int detached_state;
        res = pthread_attr_getdetachstate(h, &detached_state);
        if (res != 0)
        {
            thread_info->self.reset();
            return false;
        }
        if (PTHREAD_CREATE_DETACHED==detached_state)
        {
          detail::thread_data_ptr local_thread_info;
          thread_info.swap(local_thread_info);

          if(local_thread_info)
          {
              //lock_guard<mutex> lock(local_thread_info->data_mutex);
              if(!local_thread_info->join_started)
              {
                  //BOOST_VERIFY(!pthread_detach(local_thread_info->thread_handle));
                  local_thread_info->join_started=true;
                  local_thread_info->joined=true;
              }
          }
        }
        return true;
    }